

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> __thiscall
kern::DispatchBuilder::build(DispatchBuilder *this)

{
  void *__s;
  long *in_RSI;
  __uniq_ptr_impl<kern::Dispatch,_std::default_delete<kern::Dispatch>_> in_RDI;
  unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *d;
  pointer in_stack_ffffffffffffffc8;
  
  if (*in_RSI != 0) {
    std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>::
    unique_ptr<std::default_delete<kern::Dispatch>,void>
              ((unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *)
               in_RDI._M_t.
               super__Tuple_impl<0UL,_kern::Dispatch_*,_std::default_delete<kern::Dispatch>_>.
               super__Head_base<0UL,_kern::Dispatch_*,_false>._M_head_impl,in_stack_ffffffffffffffc8
              );
    *in_RSI = 0;
    return (__uniq_ptr_data<kern::Dispatch,_std::default_delete<kern::Dispatch>,_true,_true>)
           (__uniq_ptr_data<kern::Dispatch,_std::default_delete<kern::Dispatch>,_true,_true>)
           in_RDI._M_t.
           super__Tuple_impl<0UL,_kern::Dispatch_*,_std::default_delete<kern::Dispatch>_>.
           super__Head_base<0UL,_kern::Dispatch_*,_false>._M_head_impl;
  }
  __s = (void *)__cxa_allocate_exception(8);
  memset(__s,0,8);
  BuilderReuseException::BuilderReuseException
            ((BuilderReuseException *)
             in_RDI._M_t.
             super__Tuple_impl<0UL,_kern::Dispatch_*,_std::default_delete<kern::Dispatch>_>.
             super__Head_base<0UL,_kern::Dispatch_*,_false>._M_head_impl);
  __cxa_throw(__s,&BuilderReuseException::typeinfo,BuilderReuseException::~BuilderReuseException);
}

Assistant:

std::unique_ptr<Dispatch> DispatchBuilder::build() {
         if(this->inner == nullptr)
            throw BuilderReuseException();

        auto d = std::unique_ptr<Dispatch>(this->inner);

        // Marks the Builder as being exhausted.
        this->inner = nullptr;

        return d;
    }